

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_vproc.cpp
# Opt level: O3

void dec_vproc_clr_prev(MppDecVprocCtxImpl *ctx)

{
  dec_vproc_clr_prev0(ctx);
  dec_vproc_clr_prev1(ctx);
  if (ctx->out_buf0 != (MppBuffer)0x0) {
    mpp_buffer_put_with_caller(ctx->out_buf0,"dec_vproc_clr_prev");
    ctx->out_buf0 = (MppBuffer)0x0;
  }
  if (ctx->out_buf1 != (MppBuffer)0x0) {
    mpp_buffer_put_with_caller(ctx->out_buf1,"dec_vproc_clr_prev");
    ctx->out_buf1 = (MppBuffer)0x0;
  }
  return;
}

Assistant:

static void dec_vproc_clr_prev(MppDecVprocCtxImpl *ctx)
{
    dec_vproc_clr_prev0(ctx);
    dec_vproc_clr_prev1(ctx);
    if (ctx->out_buf0) {
        mpp_buffer_put(ctx->out_buf0);
        ctx->out_buf0 = NULL;
    }
    if (ctx->out_buf1) {
        mpp_buffer_put(ctx->out_buf1);
        ctx->out_buf1 = NULL;
    }
}